

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.h
# Opt level: O3

void __thiscall wallet::SQLiteBatch::~SQLiteBatch(SQLiteBatch *this)

{
  long lVar1;
  SQliteExecHandler *pSVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_DatabaseBatch)._vptr_DatabaseBatch = (_func_int **)&PTR_ReadKey_00b28100;
  Close(this);
  pSVar2 = (this->m_exec_handler)._M_t.
           super___uniq_ptr_impl<wallet::SQliteExecHandler,_std::default_delete<wallet::SQliteExecHandler>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::SQliteExecHandler_*,_std::default_delete<wallet::SQliteExecHandler>_>
           .super__Head_base<0UL,_wallet::SQliteExecHandler_*,_false>._M_head_impl;
  if (pSVar2 != (SQliteExecHandler *)0x0) {
    (*pSVar2->_vptr_SQliteExecHandler[1])();
  }
  (this->m_exec_handler)._M_t.
  super___uniq_ptr_impl<wallet::SQliteExecHandler,_std::default_delete<wallet::SQliteExecHandler>_>.
  _M_t.
  super__Tuple_impl<0UL,_wallet::SQliteExecHandler_*,_std::default_delete<wallet::SQliteExecHandler>_>
  .super__Head_base<0UL,_wallet::SQliteExecHandler_*,_false>._M_head_impl = (SQliteExecHandler *)0x0
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~SQLiteBatch() override { Close(); }